

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O1

bool validation(Board *board,int row,int col,Ship *ship)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  
  bVar1 = false;
  uVar2 = row - 1;
  do {
    bVar5 = false;
    uVar4 = col - 2;
    do {
      uVar4 = uVar4 + 1;
      if ((((-1 < (int)uVar2) && (-1 < (int)uVar4)) && ((int)uVar2 < board->row)) &&
         (((int)uVar4 < board->column &&
          (iVar3 = std::__cxx11::string::compare
                             ((char *)((ulong)uVar4 * 0x20 +
                                      *(long *)&(board->matrix).
                                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar2].
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data)), iVar3 != 0)))) {
        if (!bVar5) {
          return bVar1;
        }
        break;
      }
      bVar5 = col < (int)uVar4;
    } while ((int)uVar4 <= col);
    bVar1 = row < (int)uVar2;
    bVar5 = row < (int)uVar2;
    uVar2 = uVar2 + 1;
    if (bVar5) {
      return bVar1;
    }
  } while( true );
}

Assistant:

bool validation( Board *board, int row, int col, Ship *ship )
{
	/* The loop begins at the left superior diagonal of the coordinate (x - 1, y - 1)
	 * and ends at the left inferior diagonal of the coordinate (x + 1, y + 1)
	 */
    for( int i = row - 1; i <= row + 1; i++ )
    {
        for( int j = col - 1; j <= col + 1; j++ )
        {
            //! If the values exceed the board's borders, they'll be skipped
            if( i < 0 or i > board->row - 1 or j < 0 or j > board->column - 1 )
            {
                continue;
            }
            //! If at least one space is different of water, the position is denied
            if( board->matrix[i][j] != "~" )
            {
                return false;
            }
        }
    }

    //! In the loop's end the position is validated
    return true;
}